

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O2

SpatialTransform *
RigidBodyDynamics::Math::Xrot
          (SpatialTransform *__return_storage_ptr__,Scalar angle_rad,Vector3d *axis)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar5 = sin(angle_rad);
  dVar6 = cos(angle_rad);
  dVar7 = 1.0 - dVar6;
  dVar1 = (axis->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2];
  dVar2 = (axis->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0];
  dVar3 = (axis->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar4 = (axis->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1];
  dVar8 = (axis->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2];
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       dVar2 * dVar2 * dVar7 + dVar6;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       dVar2 * dVar3 * dVar7 + -dVar1 * dVar5;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       dVar1 * dVar2 * dVar7 + dVar5 * dVar4;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       dVar2 * dVar3 * dVar7 + dVar5 * dVar8;
  dVar8 = dVar3 * dVar8;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       dVar3 * dVar4 * dVar7 + dVar6;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       dVar8 * dVar7 + -dVar2 * dVar5;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       dVar1 * dVar2 * dVar7 + -dVar3 * dVar5;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       dVar8 * dVar7 + dVar2 * dVar5;
  (__return_storage_ptr__->E).super_Matrix3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       dVar1 * dVar1 * dVar7 + dVar6;
  (__return_storage_ptr__->r).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  (__return_storage_ptr__->r).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0;
  (__return_storage_ptr__->r).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

inline SpatialTransform Xrot (Scalar angle_rad, const Vector3d &axis) {
  Scalar s, c;
  s = sin(angle_rad);
  c = cos(angle_rad);

  return SpatialTransform (
      Matrix3d (
        axis[0] * axis[0] * (1.0f - c) + c,
        axis[1] * axis[0] * (1.0f - c) + axis[2] * s,
        axis[0] * axis[2] * (1.0f - c) - axis[1] * s,

        axis[0] * axis[1] * (1.0f - c) - axis[2] * s,
        axis[1] * axis[1] * (1.0f - c) + c,
        axis[1] * axis[2] * (1.0f - c) + axis[0] * s,

        axis[0] * axis[2] * (1.0f - c) + axis[1] * s,
        axis[1] * axis[2] * (1.0f - c) - axis[0] * s,
        axis[2] * axis[2] * (1.0f - c) + c

        ),
      Vector3d (0., 0., 0.)
      );
}